

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

string * __thiscall FIX::Message::toXML_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  toXML(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::toXML() const
{
  std::string str;
  toXML( str );
  return str;
}